

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void capnp::_::expectPrimitiveEq<capnp::Data::Reader>(Reader a,Reader b)

{
  bool bVar1;
  bool local_29;
  undefined1 auStack_28 [7];
  bool _kj_shouldLog;
  Reader b_local;
  Reader a_local;
  
  b_local.super_ArrayPtr<const_unsigned_char>.ptr =
       (uchar *)b.super_ArrayPtr<const_unsigned_char>.size_;
  _auStack_28 = b.super_ArrayPtr<const_unsigned_char>.ptr;
  b_local.super_ArrayPtr<const_unsigned_char>.size_ =
       (size_t)a.super_ArrayPtr<const_unsigned_char>.ptr;
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)
                     &b_local.super_ArrayPtr<const_unsigned_char>.size_,
                     (ArrayPtr<const_unsigned_char> *)auStack_28);
  if (!bVar1) {
    local_29 = kj::_::Debug::shouldLog(ERROR);
    while (local_29 != false) {
      kj::_::Debug::log<char_const(&)[28],capnp::Data::Reader&,capnp::Data::Reader&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                 ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                 (char (*) [28])"failed: expected (a) == (b)",
                 (Reader *)&b_local.super_ArrayPtr<const_unsigned_char>.size_,(Reader *)auStack_28);
      local_29 = false;
    }
  }
  return;
}

Assistant:

void expectPrimitiveEq(T a, T b) { EXPECT_EQ(a, b); }